

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
ft::vector<int,ft::allocator<int>>::insert<int*>
          (vector<int,ft::allocator<int>> *this,iterator position,int *first,int *last,type *param_4
          )

{
  iterator piVar1;
  value_type_conflict *local_70;
  iterator it;
  allocator<int> local_51;
  undefined1 local_50 [8];
  vector<int,_ft::allocator<int>_> tmp;
  type *param_4_local;
  int *last_local;
  int *first_local;
  iterator position_local;
  vector<int,_ft::allocator<int>_> *this_local;
  
  tmp._24_8_ = param_4;
  piVar1 = vector<int,_ft::allocator<int>_>::end((vector<int,_ft::allocator<int>_> *)this);
  allocator<int>::allocator(&local_51);
  vector<int*>((vector<int,ft::allocator<int>> *)local_50,position,piVar1,&local_51,(type *)0x0);
  allocator<int>::~allocator(&local_51);
  while (piVar1 = vector<int,_ft::allocator<int>_>::end((vector<int,_ft::allocator<int>_> *)this),
        last_local = first, position != piVar1) {
    vector<int,_ft::allocator<int>_>::pop_back((vector<int,_ft::allocator<int>_> *)this);
  }
  for (; last_local != last; last_local = last_local + 1) {
    vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,last_local)
    ;
  }
  for (local_70 = vector<int,_ft::allocator<int>_>::begin
                            ((vector<int,_ft::allocator<int>_> *)local_50);
      piVar1 = vector<int,_ft::allocator<int>_>::end((vector<int,_ft::allocator<int>_> *)local_50),
      local_70 != piVar1; local_70 = local_70 + 1) {
    vector<int,_ft::allocator<int>_>::push_back((vector<int,_ft::allocator<int>_> *)this,local_70);
  }
  vector<int,_ft::allocator<int>_>::~vector((vector<int,_ft::allocator<int>_> *)local_50);
  return;
}

Assistant:

void        insert(iterator position, Iterator first, Iterator last,
					   typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		vector	tmp(position, this->end());
		while (position != this->end())
			this->pop_back();
		while (first != last) {
			this->push_back(*first);
			++first;
		}
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
	}